

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double find_split_full_gain<float,long_double>
                 (float *x,size_t st,size_t end,size_t *ix_arr,size_t *cols_use,size_t ncols_use,
                 bool force_cols_use,double *X_row_major,size_t ncols,double *Xr,size_t *Xr_ind,
                 size_t *Xr_indptr,double *buffer_sum_left,double *buffer_sum_tot,size_t *split_ix,
                 double *split_point,bool x_uses_ix_arr)

{
  ulong *puVar1;
  double dVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  ulong *puVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  if (end < st || end - st == 0) {
    return -INFINITY;
  }
  if ((ncols_use != 0 && cols_use != (size_t *)0x0) &&
     (auVar28._8_4_ = (int)(ncols_use >> 0x20), auVar28._0_8_ = ncols_use,
     auVar28._12_4_ = 0x45300000, auVar25._8_4_ = (int)(ncols >> 0x20), auVar25._0_8_ = ncols,
     auVar25._12_4_ = 0x45300000,
     ((auVar28._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)ncols_use) - 4503599627370496.0)) /
     ((auVar25._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)ncols) - 4503599627370496.0)) < 0.1)) {
    force_cols_use = true;
  }
  sVar6 = ncols;
  if (force_cols_use != false) {
    sVar6 = ncols_use;
  }
  memset(buffer_sum_tot,0,sVar6 << 3);
  if (Xr_indptr == (size_t *)0x0) {
    if (force_cols_use == false) {
      uVar8 = st;
      if (st <= end) {
        do {
          if (ncols != 0) {
            sVar5 = ix_arr[uVar8];
            sVar9 = 0;
            do {
              buffer_sum_tot[sVar9] = X_row_major[sVar5 * ncols + sVar9] + buffer_sum_tot[sVar9];
              sVar9 = sVar9 + 1;
            } while (ncols != sVar9);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 <= end);
      }
    }
    else {
      uVar8 = st;
      if (st <= end) {
        do {
          if (ncols_use != 0) {
            sVar5 = ix_arr[uVar8];
            sVar9 = 0;
            do {
              buffer_sum_tot[sVar9] =
                   X_row_major[sVar5 * ncols + cols_use[sVar9]] + buffer_sum_tot[sVar9];
              sVar9 = sVar9 + 1;
            } while (ncols_use != sVar9);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 <= end);
      }
    }
  }
  else if (force_cols_use == false) {
    uVar8 = st;
    if (st <= end) {
      do {
        sVar9 = Xr_indptr[ix_arr[uVar8] + 1];
        for (sVar5 = Xr_indptr[ix_arr[uVar8]]; sVar9 != sVar5; sVar5 = sVar5 + 1) {
          buffer_sum_tot[Xr_ind[sVar5]] = Xr[sVar5] + buffer_sum_tot[Xr_ind[sVar5]];
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 <= end);
    }
  }
  else if (st <= end) {
    sVar5 = st;
    do {
      sVar9 = Xr_indptr[ix_arr[sVar5]];
      sVar3 = Xr_indptr[ix_arr[sVar5] + 1];
      if (((sVar9 != sVar3) && (0 < (long)ncols_use)) && ((long)sVar9 < (long)sVar3)) {
        puVar1 = Xr_ind + sVar3;
        puVar10 = Xr_ind + sVar9;
        puVar11 = cols_use;
        do {
          uVar8 = *puVar10;
          uVar4 = *puVar11;
          if (uVar8 == uVar4) {
            *(double *)((long)buffer_sum_tot + ((long)puVar11 - (long)cols_use)) =
                 *(double *)((long)Xr + (long)puVar1 + (sVar9 * 8 - (long)puVar10)) +
                 *(double *)((long)buffer_sum_tot + ((long)puVar11 - (long)cols_use));
            puVar11 = puVar11 + 1;
            puVar10 = puVar10 + 1;
          }
          else if (uVar4 < uVar8) {
            uVar4 = (long)(cols_use + ncols_use) - (long)puVar11 >> 3;
            while (0 < (long)uVar4) {
              uVar12 = uVar4 >> 1;
              uVar13 = ~uVar12 + uVar4;
              uVar4 = uVar12;
              if (puVar11[uVar12] < uVar8) {
                uVar4 = uVar13;
                puVar11 = puVar11 + uVar12 + 1;
              }
            }
          }
          else {
            uVar8 = (long)puVar1 - (long)puVar10 >> 3;
            while (0 < (long)uVar8) {
              uVar12 = uVar8 >> 1;
              uVar13 = ~uVar12 + uVar8;
              uVar8 = uVar12;
              if (puVar10[uVar12] < uVar4) {
                uVar8 = uVar13;
                puVar10 = puVar10 + uVar12 + 1;
              }
            }
          }
        } while ((puVar11 < cols_use + ncols_use) && (puVar10 < puVar1));
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 <= end);
  }
  memset(buffer_sum_left,0,sVar6 << 3);
  if (Xr_indptr == (size_t *)0x0) {
    if (force_cols_use == false) {
      if (st < end) {
        dVar21 = -INFINITY;
        sVar6 = st;
        do {
          sVar5 = ix_arr[sVar6];
          if (ncols != 0) {
            sVar9 = 0;
            do {
              buffer_sum_left[sVar9] = X_row_major[sVar5 * ncols + sVar9] + buffer_sum_left[sVar9];
              sVar9 = sVar9 + 1;
            } while (ncols != sVar9);
          }
          if (x_uses_ix_arr) {
            bVar14 = NAN(x[sVar5]) || NAN(x[ix_arr[sVar6 + 1]]);
            bVar15 = x[sVar5] == x[ix_arr[sVar6 + 1]];
          }
          else {
            bVar14 = NAN(x[sVar6]) || NAN(x[sVar6 + 1]);
            bVar15 = x[sVar6] == x[sVar6 + 1];
          }
          if ((!bVar15) || (bVar14)) {
            uVar8 = (sVar6 - st) + 1;
            if (ncols == 0) {
              dVar23 = 0.0;
            }
            else {
              auVar20._0_8_ =
                   (double)(end - sVar6 & 0xffffffff | 0x4330000000000000) +
                   ((double)(end - sVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
              auVar20._8_8_ =
                   (double)(uVar8 & 0xffffffff | 0x4330000000000000) +
                   ((double)(uVar8 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
              dVar22 = 0.0;
              dVar23 = 0.0;
              sVar5 = 0;
              do {
                dVar2 = buffer_sum_left[sVar5];
                auVar29._8_8_ = dVar2;
                auVar29._0_8_ = buffer_sum_tot[sVar5] - dVar2;
                auVar28 = divpd(auVar29,auVar20);
                dVar22 = dVar22 + auVar28._0_8_ * (buffer_sum_tot[sVar5] - dVar2);
                dVar23 = dVar23 + auVar28._8_8_ * dVar2;
                sVar5 = sVar5 + 1;
              } while (ncols != sVar5);
              dVar23 = dVar23 + dVar22;
            }
            if (dVar21 < dVar23) {
              *split_ix = sVar6;
              dVar21 = dVar23;
            }
          }
          sVar6 = sVar6 + 1;
        } while (sVar6 != end);
        goto LAB_00289ace;
      }
    }
    else if (st < end) {
      dVar21 = -INFINITY;
      sVar6 = st;
      do {
        sVar5 = ix_arr[sVar6];
        if (ncols_use != 0) {
          sVar9 = 0;
          do {
            buffer_sum_left[sVar9] =
                 X_row_major[sVar5 * ncols + cols_use[sVar9]] + buffer_sum_left[sVar9];
            sVar9 = sVar9 + 1;
          } while (ncols_use != sVar9);
        }
        if (x_uses_ix_arr) {
          bVar14 = NAN(x[sVar5]) || NAN(x[ix_arr[sVar6 + 1]]);
          bVar15 = x[sVar5] == x[ix_arr[sVar6 + 1]];
        }
        else {
          bVar14 = NAN(x[sVar6]) || NAN(x[sVar6 + 1]);
          bVar15 = x[sVar6] == x[sVar6 + 1];
        }
        if ((!bVar15) || (bVar14)) {
          uVar8 = (sVar6 - st) + 1;
          if (ncols_use == 0) {
            dVar23 = 0.0;
          }
          else {
            auVar18._0_8_ =
                 (double)(end - sVar6 & 0xffffffff | 0x4330000000000000) +
                 ((double)(end - sVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
            auVar18._8_8_ =
                 (double)(uVar8 & 0xffffffff | 0x4330000000000000) +
                 ((double)(uVar8 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
            dVar22 = 0.0;
            dVar23 = 0.0;
            sVar5 = 0;
            do {
              dVar2 = buffer_sum_left[sVar5];
              auVar26._8_8_ = dVar2;
              auVar26._0_8_ = buffer_sum_tot[sVar5] - dVar2;
              auVar28 = divpd(auVar26,auVar18);
              dVar22 = dVar22 + auVar28._0_8_ * (buffer_sum_tot[sVar5] - dVar2);
              dVar23 = dVar23 + auVar28._8_8_ * dVar2;
              sVar5 = sVar5 + 1;
            } while (ncols_use != sVar5);
            dVar23 = dVar23 + dVar22;
          }
          if (dVar21 < dVar23) {
            *split_ix = sVar6;
            dVar21 = dVar23;
          }
        }
        sVar6 = sVar6 + 1;
      } while (sVar6 != end);
      goto LAB_00289ace;
    }
  }
  else if (force_cols_use == false) {
    if (st < end) {
      dVar21 = -INFINITY;
      sVar6 = st;
      do {
        sVar5 = ix_arr[sVar6];
        sVar3 = Xr_indptr[sVar5 + 1];
        for (sVar9 = Xr_indptr[sVar5]; sVar3 != sVar9; sVar9 = sVar9 + 1) {
          buffer_sum_left[Xr_ind[sVar9]] = Xr[sVar9] + buffer_sum_left[Xr_ind[sVar9]];
        }
        if (x_uses_ix_arr) {
          bVar14 = NAN(x[sVar5]) || NAN(x[ix_arr[sVar6 + 1]]);
          bVar15 = x[sVar5] == x[ix_arr[sVar6 + 1]];
        }
        else {
          bVar14 = NAN(x[sVar6]) || NAN(x[sVar6 + 1]);
          bVar15 = x[sVar6] == x[sVar6 + 1];
        }
        if ((!bVar15) || (bVar14)) {
          uVar8 = (sVar6 - st) + 1;
          if (ncols == 0) {
            dVar23 = 0.0;
          }
          else {
            auVar19._0_8_ =
                 (double)(end - sVar6 & 0xffffffff | 0x4330000000000000) +
                 ((double)(end - sVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
            auVar19._8_8_ =
                 (double)(uVar8 & 0xffffffff | 0x4330000000000000) +
                 ((double)(uVar8 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
            dVar22 = 0.0;
            dVar23 = 0.0;
            sVar5 = 0;
            do {
              dVar2 = buffer_sum_left[sVar5];
              auVar27._8_8_ = dVar2;
              auVar27._0_8_ = buffer_sum_tot[sVar5] - dVar2;
              auVar28 = divpd(auVar27,auVar19);
              dVar22 = dVar22 + auVar28._0_8_ * (buffer_sum_tot[sVar5] - dVar2);
              dVar23 = dVar23 + auVar28._8_8_ * dVar2;
              sVar5 = sVar5 + 1;
            } while (ncols != sVar5);
            dVar23 = dVar23 + dVar22;
          }
          if (dVar21 < dVar23) {
            *split_ix = sVar6;
            dVar21 = dVar23;
          }
        }
        sVar6 = sVar6 + 1;
      } while (sVar6 != end);
      goto LAB_00289ace;
    }
  }
  else if (st < end) {
    auVar28 = ZEXT816(0xfff0000000000000);
    sVar6 = st;
    do {
      sVar5 = ix_arr[sVar6];
      sVar9 = Xr_indptr[sVar5];
      sVar3 = Xr_indptr[sVar5 + 1];
      if (((sVar9 != sVar3) && (0 < (long)ncols_use)) && ((long)sVar9 < (long)sVar3)) {
        puVar1 = Xr_ind + sVar3;
        puVar10 = Xr_ind + sVar9;
        puVar11 = cols_use;
        do {
          uVar8 = *puVar10;
          uVar4 = *puVar11;
          if (uVar8 == uVar4) {
            *(double *)((long)buffer_sum_left + ((long)puVar11 - (long)cols_use)) =
                 *(double *)((long)Xr + (long)puVar1 + (sVar9 * 8 - (long)puVar10)) +
                 *(double *)((long)buffer_sum_left + ((long)puVar11 - (long)cols_use));
            puVar11 = puVar11 + 1;
            puVar10 = puVar10 + 1;
          }
          else if (uVar4 < uVar8) {
            uVar4 = (long)(cols_use + ncols_use) - (long)puVar11 >> 3;
            while (0 < (long)uVar4) {
              uVar12 = uVar4 >> 1;
              uVar13 = ~uVar12 + uVar4;
              uVar4 = uVar12;
              if (puVar11[uVar12] < uVar8) {
                uVar4 = uVar13;
                puVar11 = puVar11 + uVar12 + 1;
              }
            }
          }
          else {
            uVar8 = (long)puVar1 - (long)puVar10 >> 3;
            while (0 < (long)uVar8) {
              uVar12 = uVar8 >> 1;
              uVar13 = ~uVar12 + uVar8;
              uVar8 = uVar12;
              if (puVar10[uVar12] < uVar4) {
                uVar8 = uVar13;
                puVar10 = puVar10 + uVar12 + 1;
              }
            }
          }
        } while ((puVar11 < cols_use + ncols_use) && (puVar10 < puVar1));
      }
      if (x_uses_ix_arr) {
        bVar14 = NAN(x[sVar5]) || NAN(x[ix_arr[sVar6 + 1]]);
        bVar15 = x[sVar5] == x[ix_arr[sVar6 + 1]];
      }
      else {
        bVar14 = NAN(x[sVar6]) || NAN(x[sVar6 + 1]);
        bVar15 = x[sVar6] == x[sVar6 + 1];
      }
      if ((!bVar15) || (bVar14)) {
        uVar8 = (sVar6 - st) + 1;
        if (ncols_use == 0) {
          auVar17 = (undefined1  [16])0x0;
        }
        else {
          auVar16._0_8_ =
               (double)(end - sVar6 & 0xffffffff | 0x4330000000000000) +
               ((double)(end - sVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
          auVar16._8_8_ =
               (double)(uVar8 & 0xffffffff | 0x4330000000000000) +
               ((double)(uVar8 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25);
          dVar21 = 0.0;
          dVar23 = 0.0;
          sVar5 = 0;
          do {
            dVar22 = buffer_sum_left[sVar5];
            auVar24._8_8_ = dVar22;
            auVar24._0_8_ = buffer_sum_tot[sVar5] - dVar22;
            auVar25 = divpd(auVar24,auVar16);
            dVar21 = dVar21 + auVar25._0_8_ * (buffer_sum_tot[sVar5] - dVar22);
            dVar23 = dVar23 + auVar25._8_8_ * dVar22;
            sVar5 = sVar5 + 1;
          } while (ncols_use != sVar5);
          auVar17._0_8_ = dVar23 + dVar21;
          auVar17._8_8_ = dVar23;
        }
        if (auVar28._0_8_ < auVar17._0_8_) {
          *split_ix = sVar6;
          auVar28 = auVar17;
        }
      }
      dVar21 = auVar28._0_8_;
      sVar6 = sVar6 + 1;
    } while (sVar6 != end);
    goto LAB_00289ace;
  }
  dVar21 = -INFINITY;
LAB_00289ace:
  if (-INFINITY < dVar21) {
    sVar6 = *split_ix;
    if (x_uses_ix_arr) {
      sVar5 = ix_arr[sVar6 + 1];
      sVar6 = ix_arr[sVar6];
    }
    else {
      sVar5 = sVar6 + 1;
    }
    dVar23 = midpoint<float>(x[sVar6],x[sVar5]);
    *split_point = dVar23;
    lVar7 = (end - st) + 1;
    dVar21 = (double)((float)dVar21 / ((float)lVar7 + (float)(&DAT_0036b0d8)[lVar7 < 0]));
  }
  return dVar21;
}

Assistant:

double find_split_full_gain(real_t *restrict x, size_t st, size_t end, size_t *restrict ix_arr,
                            size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                            double *restrict X_row_major, size_t ncols,
                            double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                            double *restrict buffer_sum_left, double *restrict buffer_sum_tot,
                            size_t &restrict split_ix, double &restrict split_point,
                            bool x_uses_ix_arr)
{
    if (end <= st) return -HUGE_VAL;
    if (cols_use != NULL && ncols_use && (double)ncols_use / (double)ncols < 0.1)
        force_cols_use = true;

    memset(buffer_sum_tot, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (force_cols_use)
        {
            double *restrict ptr_row;
            for (size_t row = st; row <= end; row++)
            {
                ptr_row = X_row_major + ix_arr[row]*ncols;
                for (size_t col = 0; col < ncols_use; col++)
                    buffer_sum_tot[col] += ptr_row[cols_use[col]];
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
                xpy1(X_row_major + ix_arr[row]*ncols, buffer_sum_tot, ncols);
        }
    }

    else
    {
        if (force_cols_use)
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            for (size_t row = st; row <= end; row++)
            {
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) continue;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        buffer_sum_tot[std::distance(cols_use, curr_col)] += Xr_this[std::distance(curr_begin, row_end)];
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }
            }
        }

        else
        {
            size_t ptr_this;
            for (size_t row = st; row <= end; row++)
            {
                ptr_this = Xr_indptr[ix_arr[row]];
                xpy1(Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_tot);
            }
        }
    }

    double best_gain = -HUGE_VAL;
    double this_gain;
    double sl, sr;
    double dl, dr;
    double vleft, vright;
    memset(buffer_sum_left, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (!force_cols_use)
        {
            for (size_t row = st; row < end; row++)
            {
                xpy1(X_row_major + ix_arr[row]*ncols, buffer_sum_left, ncols);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            double *restrict ptr_row;
            for (size_t row = st; row < end; row++)
            {
                ptr_row = X_row_major + ix_arr[row]*ncols;
                for (size_t col = 0; col < ncols_use; col++)
                    buffer_sum_left[col] += ptr_row[cols_use[col]];
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    else
    {
        if (!force_cols_use)
        {
            size_t ptr_this;
            for (size_t row = st; row < end; row++)
            {
                ptr_this = Xr_indptr[ix_arr[row]];
                xpy1(Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_left);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            for (size_t row = st; row < end; row++)
            {
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) goto skip_sum;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        buffer_sum_left[std::distance(cols_use, curr_col)] += Xr_this[std::distance(curr_begin, row_end)];
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }

                skip_sum:
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    if (best_gain <= -HUGE_VAL) return best_gain;

    if (x_uses_ix_arr)
        split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);
    else
        split_point = midpoint(x[split_ix], x[split_ix+1]);
    return best_gain / (ldouble_safe)(end - st + 1);
}